

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O1

void __thiscall Assimp::FBX::Document::ReadConnections(Document *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *p_Var2;
  Element *el;
  _Base_ptr p_Var3;
  int iVar4;
  const_iterator cVar5;
  Token *pTVar6;
  pointer src;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *dest;
  _Base_ptr p_Var7;
  Connection *this_00;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var8;
  _Base_ptr p_Var9;
  Token *t;
  Token *t_00;
  long lVar10;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  pVar11;
  key_type local_b8;
  string local_98;
  Document *local_78;
  uint64_t local_70;
  _Rb_tree_node_base *local_68;
  string local_60;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
  *local_40;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
  *local_38;
  
  p_Var2 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
            *)(this->parser->root)._M_t.
              super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
              _M_t.
              super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
              .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_78 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Connections","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
          ::find(p_Var2,&local_b8);
  if (cVar5._M_node == &(p_Var2->_M_impl).super__Rb_tree_header._M_header) {
    lVar10 = 0;
  }
  else {
    lVar10 = *(long *)(cVar5._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((lVar10 == 0) ||
     (p_Var2 = *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                 **)(lVar10 + 0x20),
     p_Var2 == (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
                *)0x0)) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"no Connections dictionary found","");
    Util::DOMError(&local_b8,(Element *)0x0);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"C","");
  pVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
           ::equal_range(p_Var2,&local_b8);
  local_68 = (_Rb_tree_node_base *)pVar11.second._M_node;
  _Var8 = pVar11.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (_Var8._M_node != local_68) {
    p_Var1 = &(local_78->objects)._M_t._M_impl.super__Rb_tree_header;
    local_38 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
                *)&local_78->src_connections;
    local_40 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
                *)&local_78->dest_connections;
    local_70 = 0;
    do {
      el = *(Element **)(_Var8._M_node + 2);
      pTVar6 = GetRequiredToken(el,0);
      ParseTokenAsString_abi_cxx11_(&local_b8,(FBX *)pTVar6,t);
      iVar4 = std::__cxx11::string::compare((char *)&local_b8);
      if (iVar4 != 0) {
        pTVar6 = GetRequiredToken(el,1);
        src = (pointer)ParseTokenAsID(pTVar6);
        pTVar6 = GetRequiredToken(el,2);
        dest = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)ParseTokenAsID(pTVar6);
        iVar4 = std::__cxx11::string::compare((char *)&local_b8);
        if (iVar4 == 0) {
          pTVar6 = GetRequiredToken(el,3);
          ParseTokenAsString_abi_cxx11_(&local_60,(FBX *)pTVar6,t_00);
        }
        else {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
        }
        p_Var3 = (local_78->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var9 = &p_Var1->_M_header;
        for (p_Var7 = p_Var3; p_Var7 != (_Base_ptr)0x0;
            p_Var7 = (&p_Var7->_M_left)[*(pointer *)(p_Var7 + 1) < src]) {
          if (*(pointer *)(p_Var7 + 1) >= src) {
            p_Var9 = p_Var7;
          }
        }
        p_Var7 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
           (p_Var7 = p_Var9, src < *(pointer *)(p_Var9 + 1))) {
          p_Var7 = &p_Var1->_M_header;
        }
        p_Var9 = &p_Var1->_M_header;
        if ((_Rb_tree_header *)p_Var7 == p_Var1) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"source object for connection does not exist","");
          Util::DOMWarning(&local_98,el);
LAB_0060834a:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          for (; p_Var3 != (_Base_ptr)0x0;
              p_Var3 = (&p_Var3->_M_left)[*(undefined1 **)(p_Var3 + 1) < dest]) {
            if (*(undefined1 **)(p_Var3 + 1) >= dest) {
              p_Var9 = p_Var3;
            }
          }
          p_Var7 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
             (p_Var7 = p_Var9, dest < *(undefined1 **)(p_Var9 + 1))) {
            p_Var7 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var7 == p_Var1) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,"destination object for connection does not exist","");
            Util::DOMWarning(&local_98,el);
            goto LAB_0060834a;
          }
          this_00 = (Connection *)operator_new(0x40);
          Connection::Connection(this_00,local_70,(uint64_t)src,(uint64_t)dest,&local_60,local_78);
          local_98._M_dataplus._M_p = src;
          local_98._M_string_length = (size_type)this_00;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
          ::_M_insert_equal<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>
                    (local_38,(pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> *)
                              &local_98);
          local_98._M_dataplus._M_p = (pointer)dest;
          local_98._M_string_length = (size_type)this_00;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>,std::_Select1st<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>>
          ::_M_insert_equal<std::pair<unsigned_long_const,Assimp::FBX::Connection_const*>>
                    (local_40,(pair<const_unsigned_long,_const_Assimp::FBX::Connection_*> *)
                              &local_98);
          local_70 = local_70 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      _Var8._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var8._M_node);
    } while (_Var8._M_node != local_68);
  }
  return;
}

Assistant:

void Document::ReadConnections()
{
    const Scope& sc = parser.GetRootScope();
    // read property templates from "Definitions" section
    const Element* const econns = sc["Connections"];
    if(!econns || !econns->Compound()) {
        DOMError("no Connections dictionary found");
    }

    uint64_t insertionOrder = 0l;
    const Scope& sconns = *econns->Compound();
    const ElementCollection conns = sconns.GetCollection("C");
    for(ElementMap::const_iterator it = conns.first; it != conns.second; ++it) {
        const Element& el = *(*it).second;
        const std::string& type = ParseTokenAsString(GetRequiredToken(el,0));

        // PP = property-property connection, ignored for now
        // (tokens: "PP", ID1, "Property1", ID2, "Property2")
        if ( type == "PP" ) {
            continue;
        }

        const uint64_t src = ParseTokenAsID(GetRequiredToken(el,1));
        const uint64_t dest = ParseTokenAsID(GetRequiredToken(el,2));

        // OO = object-object connection
        // OP = object-property connection, in which case the destination property follows the object ID
        const std::string& prop = (type == "OP" ? ParseTokenAsString(GetRequiredToken(el,3)) : "");

        if(objects.find(src) == objects.end()) {
            DOMWarning("source object for connection does not exist",&el);
            continue;
        }

        // dest may be 0 (root node) but we added a dummy object before
        if(objects.find(dest) == objects.end()) {
            DOMWarning("destination object for connection does not exist",&el);
            continue;
        }

        // add new connection
        const Connection* const c = new Connection(insertionOrder++,src,dest,prop,*this);
        src_connections.insert(ConnectionMap::value_type(src,c));
        dest_connections.insert(ConnectionMap::value_type(dest,c));
    }
}